

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_cp_setfromcod(jpc_dec_cp_t *cp,jpc_cod_t *cod)

{
  uint_fast16_t uVar1;
  uint_fast8_t uVar2;
  int iVar3;
  ulong uVar4;
  int in_ECX;
  int iVar5;
  jpc_dec_ccp_t *cp_00;
  
  *(byte *)&cp->flags = (byte)cp->flags | 1;
  cp->prgord = cod->prg;
  if (cod->mctrans == '\0') {
    uVar2 = '\0';
  }
  else {
    uVar2 = '\x02' - ((cod->compparms).qmfbid == '\0');
  }
  cp->mctid = uVar2;
  uVar1 = cod->numlyrs;
  cp->numlyrs = uVar1;
  uVar4 = CONCAT71((int7)(uVar1 >> 8),cod->csty) & 0xffffffffffffff06;
  iVar3 = (int)uVar4;
  cp->csty = (uint_fast8_t)uVar4;
  if (0 < cp->numcomps) {
    cp_00 = cp->ccps;
    iVar5 = 0;
    do {
      iVar3 = jpc_dec_cp_setfromcox
                        ((jpc_dec_cp_t *)cp_00,(jpc_dec_ccp_t *)&cod->compparms,(jpc_coxcp_t *)0x0,
                         in_ECX);
      iVar5 = iVar5 + 1;
      cp_00 = cp_00 + 1;
    } while (iVar5 < cp->numcomps);
  }
  *(byte *)&cp->flags = (byte)cp->flags | 1;
  return iVar3;
}

Assistant:

static int jpc_dec_cp_setfromcod(jpc_dec_cp_t *cp, jpc_cod_t *cod)
{
	jpc_dec_ccp_t *ccp;
	int compno;
	cp->flags |= JPC_CSET;
	cp->prgord = cod->prg;
	if (cod->mctrans) {
		cp->mctid = (cod->compparms.qmfbid == JPC_COX_INS) ? (JPC_MCT_ICT) : (JPC_MCT_RCT);
	} else {
		cp->mctid = JPC_MCT_NONE;
	}
	cp->numlyrs = cod->numlyrs;
	cp->csty = cod->csty & (JPC_COD_SOP | JPC_COD_EPH);
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		jpc_dec_cp_setfromcox(cp, ccp, &cod->compparms, 0);
	}
	cp->flags |= JPC_CSET;
	return 0;
}